

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O1

unsigned_long
AdaptingProcess(PaUtilBufferProcessor *bp,int *streamCallbackResult,int processPartialUserBuffers)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  void **ppvVar3;
  PaStreamCallbackTimeInfo *pPVar4;
  int iVar5;
  unsigned_long uVar6;
  ulong uVar7;
  unsigned_long *puVar8;
  void ***pppvVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  void *pvVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  PaUtilChannelDescriptor *pPVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  double dVar21;
  unsigned_long local_88;
  
  uVar16 = bp->hostInputFrameCount[1] + bp->hostInputFrameCount[0];
  if (processPartialUserBuffers == 0) {
    uVar12 = bp->framesPerUserBuffer - 1;
  }
  else {
    uVar12 = 0;
  }
  CopyTempOutputBuffersToHostOutputBuffers(bp);
  if (uVar12 < uVar16) {
    puVar1 = bp->hostInputFrameCount;
    puVar2 = bp->hostInputFrameCount + 1;
    local_88 = 0;
    do {
      if ((bp->framesInTempOutputBuffer == 0) && (*streamCallbackResult != 0)) {
        lVar13 = 0;
        do {
          uVar15 = (uint)bp->hostOutputFrameCount[lVar13];
          if (uVar15 != 0) {
            if (bp->outputChannelCount != 0) {
              pPVar18 = bp->hostOutputChannels[lVar13];
              uVar17 = 0;
              do {
                (*bp->outputZeroer)(pPVar18->data,pPVar18->stride,uVar15);
                pPVar18->data =
                     (void *)((long)pPVar18->data +
                             (ulong)(pPVar18->stride * uVar15 * bp->bytesPerHostOutputSample));
                uVar17 = uVar17 + 1;
                pPVar18 = pPVar18 + 1;
              } while (uVar17 < bp->outputChannelCount);
            }
            bp->hostOutputFrameCount[lVar13] = 0;
          }
          bVar19 = lVar13 == 0;
          lVar13 = lVar13 + 1;
        } while (bVar19);
      }
      uVar11 = bp->framesPerUserBuffer;
      uVar17 = bp->framesInTempInputBuffer;
      if (uVar17 < uVar11) {
        do {
          uVar6 = *puVar1;
          if (uVar6 + *puVar2 == 0) break;
          uVar7 = *puVar2;
          if (uVar6 != 0) {
            uVar7 = uVar6;
          }
          if (uVar11 - uVar17 <= uVar7) {
            uVar7 = uVar11 - uVar17;
          }
          if (bp->userInputIsInterleaved == 0) {
            pvVar14 = (void *)(uVar17 * bp->bytesPerUserInputSample + (long)bp->tempInputBuffer);
            uVar10 = (int)uVar11 * bp->bytesPerUserInputSample;
            uVar15 = 1;
          }
          else {
            uVar15 = bp->inputChannelCount;
            uVar10 = bp->bytesPerUserInputSample;
            pvVar14 = (void *)(uVar17 * (uVar15 * uVar10) + (long)bp->tempInputBuffer);
          }
          if (bp->inputChannelCount != 0) {
            pPVar18 = bp->hostInputChannels[uVar6 == 0];
            uVar17 = 0;
            do {
              (*bp->inputConverter)
                        (pvVar14,uVar15,pPVar18->data,pPVar18->stride,(uint)uVar7,
                         &bp->ditherGenerator);
              pvVar14 = (void *)((long)pvVar14 + (ulong)uVar10);
              pPVar18->data =
                   (void *)((long)pPVar18->data +
                           (ulong)(pPVar18->stride * (uint)uVar7 * bp->bytesPerHostInputSample));
              uVar17 = uVar17 + 1;
              pPVar18 = pPVar18 + 1;
            } while (uVar17 < bp->inputChannelCount);
          }
          uVar6 = *puVar1;
          puVar8 = puVar1;
          if (uVar6 == 0) {
            uVar6 = *puVar2;
            puVar8 = puVar2;
          }
          *puVar8 = uVar6 - (uVar7 & 0xffffffff);
          uVar7 = uVar7 & 0xffffffff;
          uVar17 = bp->framesInTempInputBuffer + uVar7;
          bp->framesInTempInputBuffer = uVar17;
          uVar16 = uVar16 - uVar7;
          local_88 = local_88 + uVar7;
          uVar11 = bp->framesPerUserBuffer;
        } while (uVar17 < uVar11);
      }
      if ((uVar17 == uVar11) && (bp->framesInTempOutputBuffer == 0)) {
        if (*streamCallbackResult == 0) {
          pppvVar9 = (void ***)&bp->tempInputBuffer;
          if ((bp->userInputIsInterleaved == 0) &&
             (uVar15 = bp->inputChannelCount, pppvVar9 = &bp->tempInputBufferPtrs,
             (ulong)uVar15 != 0)) {
            uVar10 = bp->bytesPerUserInputSample;
            lVar13 = 0;
            uVar17 = 0;
            do {
              bp->tempInputBufferPtrs[uVar17] = (void *)((long)bp->tempInputBuffer + lVar13);
              uVar17 = uVar17 + 1;
              lVar13 = lVar13 + uVar10 * uVar11;
            } while (uVar15 != uVar17);
          }
          ppvVar3 = *pppvVar9;
          pppvVar9 = (void ***)&bp->tempOutputBuffer;
          if ((bp->userOutputIsInterleaved == 0) &&
             (uVar15 = bp->outputChannelCount, pppvVar9 = &bp->tempOutputBufferPtrs,
             (ulong)uVar15 != 0)) {
            uVar10 = bp->bytesPerUserOutputSample;
            lVar13 = 0;
            uVar17 = 0;
            do {
              bp->tempOutputBufferPtrs[uVar17] = (void *)((long)bp->tempOutputBuffer + lVar13);
              uVar17 = uVar17 + 1;
              lVar13 = lVar13 + uVar10 * uVar11;
            } while (uVar15 != uVar17);
          }
          iVar5 = (*bp->streamCallback)
                            (ppvVar3,*pppvVar9,uVar11,bp->timeInfo,bp->callbackStatusFlags,
                             bp->userData);
          *streamCallbackResult = iVar5;
          uVar6 = bp->framesPerUserBuffer;
          pPVar4 = bp->timeInfo;
          auVar20._8_4_ = (int)(uVar6 >> 0x20);
          auVar20._0_8_ = uVar6;
          auVar20._12_4_ = 0x45300000;
          dVar21 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) *
                   bp->samplePeriod;
          pPVar4->inputBufferAdcTime = pPVar4->inputBufferAdcTime + dVar21;
          pPVar4->outputBufferDacTime = dVar21 + pPVar4->outputBufferDacTime;
          bp->framesInTempInputBuffer = 0;
          if (iVar5 == 2) {
            bp->framesInTempOutputBuffer = 0;
          }
          else {
            bp->framesInTempOutputBuffer = uVar6;
          }
        }
        else {
          bp->framesInTempInputBuffer = 0;
        }
      }
      CopyTempOutputBuffersToHostOutputBuffers(bp);
    } while (uVar12 < uVar16);
  }
  else {
    local_88 = 0;
  }
  return local_88;
}

Assistant:

static unsigned long AdaptingProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult, int processPartialUserBuffers )
{
    void *userInput, *userOutput;
    unsigned long framesProcessed = 0;
    unsigned long framesAvailable;
    unsigned long endProcessingMinFrameCount;
    unsigned long maxFramesToCopy;
    PaUtilChannelDescriptor *hostInputChannels, *hostOutputChannels;
    unsigned int frameCount;
    unsigned char *destBytePtr;
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i, j;


    framesAvailable = bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1];/* this is assumed to be the same as the output buffer's frame count */

    if( processPartialUserBuffers )
        endProcessingMinFrameCount = 0;
    else
        endProcessingMinFrameCount = (bp->framesPerUserBuffer - 1);

    /* Fill host output with remaining frames in user output (tempOutputBuffer) */
    CopyTempOutputBuffersToHostOutputBuffers( bp );

    while( framesAvailable > endProcessingMinFrameCount )
    {

        if( bp->framesInTempOutputBuffer == 0 && *streamCallbackResult != paContinue )
        {
            /* the callback will not be called any more, so zero what remains
                of the host output buffers */

            for( i=0; i<2; ++i )
            {
                frameCount = bp->hostOutputFrameCount[i];
                if( frameCount > 0 )
                {
                    hostOutputChannels = bp->hostOutputChannels[i];

                    for( j=0; j<bp->outputChannelCount; ++j )
                    {
                        bp->outputZeroer(   hostOutputChannels[j].data,
                                            hostOutputChannels[j].stride,
                                            frameCount );

                        /* advance dest ptr for next iteration  */
                        hostOutputChannels[j].data = ((unsigned char*)hostOutputChannels[j].data) +
                                frameCount * hostOutputChannels[j].stride * bp->bytesPerHostOutputSample;
                    }
                    bp->hostOutputFrameCount[i] = 0;
                }
            }
        }


        /* copy frames from host to user input buffers */
        while( bp->framesInTempInputBuffer < bp->framesPerUserBuffer &&
                ((bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1]) > 0) )
        {
            maxFramesToCopy = bp->framesPerUserBuffer - bp->framesInTempInputBuffer;

            /* select the input buffer set (1st or 2nd) */
            if( bp->hostInputFrameCount[0] > 0 )
            {
                hostInputChannels = bp->hostInputChannels[0];
                frameCount = PA_MIN_( bp->hostInputFrameCount[0], maxFramesToCopy );
            }
            else
            {
                hostInputChannels = bp->hostInputChannels[1];
                frameCount = PA_MIN_( bp->hostInputFrameCount[1], maxFramesToCopy );
            }

            /* configure conversion destination pointers */
            if( bp->userInputIsInterleaved )
            {
                destBytePtr = ((unsigned char*)bp->tempInputBuffer) +
                        bp->bytesPerUserInputSample * bp->inputChannelCount *
                        bp->framesInTempInputBuffer;

                destSampleStrideSamples = bp->inputChannelCount;
                destChannelStrideBytes = bp->bytesPerUserInputSample;
            }
            else /* user input is not interleaved */
            {
                destBytePtr = ((unsigned char*)bp->tempInputBuffer) +
                        bp->bytesPerUserInputSample * bp->framesInTempInputBuffer;

                destSampleStrideSamples = 1;
                destChannelStrideBytes = bp->framesPerUserBuffer * bp->bytesPerUserInputSample;
            }

            for( i=0; i<bp->inputChannelCount; ++i )
            {
                bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                        hostInputChannels[i].data,
                                        hostInputChannels[i].stride,
                                        frameCount, &bp->ditherGenerator );

                destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */

                /* advance src ptr for next iteration */
                hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                        frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
            }

            if( bp->hostInputFrameCount[0] > 0 )
                bp->hostInputFrameCount[0] -= frameCount;
            else
                bp->hostInputFrameCount[1] -= frameCount;

            bp->framesInTempInputBuffer += frameCount;

            /* update framesAvailable and framesProcessed based on input consumed
                unless something is very wrong this will also correspond to the
                amount of output generated */
            framesAvailable -= frameCount;
            framesProcessed += frameCount;
        }

        /* call streamCallback */
        if( bp->framesInTempInputBuffer == bp->framesPerUserBuffer &&
            bp->framesInTempOutputBuffer == 0 )
        {
            if( *streamCallbackResult == paContinue )
            {
                /* setup userInput */
                if( bp->userInputIsInterleaved )
                {
                    userInput = bp->tempInputBuffer;
                }
                else /* user input is not interleaved */
                {
                    for( i = 0; i < bp->inputChannelCount; ++i )
                    {
                        bp->tempInputBufferPtrs[i] = ((unsigned char*)bp->tempInputBuffer) +
                                i * bp->framesPerUserBuffer * bp->bytesPerUserInputSample;
                    }

                    userInput = bp->tempInputBufferPtrs;
                }

                /* setup userOutput */
                if( bp->userOutputIsInterleaved )
                {
                    userOutput = bp->tempOutputBuffer;
                }
                else /* user output is not interleaved */
                {
                    for( i = 0; i < bp->outputChannelCount; ++i )
                    {
                        bp->tempOutputBufferPtrs[i] = ((unsigned char*)bp->tempOutputBuffer) +
                                i * bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
                    }

                    userOutput = bp->tempOutputBufferPtrs;
                }

                /* call streamCallback */

                *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                        bp->framesPerUserBuffer, bp->timeInfo,
                        bp->callbackStatusFlags, bp->userData );

                bp->timeInfo->inputBufferAdcTime += bp->framesPerUserBuffer * bp->samplePeriod;
                bp->timeInfo->outputBufferDacTime += bp->framesPerUserBuffer * bp->samplePeriod;

                bp->framesInTempInputBuffer = 0;

                if( *streamCallbackResult == paAbort )
                    bp->framesInTempOutputBuffer = 0;
                else
                    bp->framesInTempOutputBuffer = bp->framesPerUserBuffer;
            }
            else
            {
                /* paComplete or paAbort has already been called. */

                bp->framesInTempInputBuffer = 0;
            }
        }

        /* copy frames from user (tempOutputBuffer) to host output buffers (hostOutputChannels)
           Means to process the user output provided by the callback. Has to be called after
            each callback. */
        CopyTempOutputBuffersToHostOutputBuffers( bp );

    }

    return framesProcessed;
}